

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

TPZCompMesh * __thiscall TPZMHMeshControl::CriaMalhaTemporaria(TPZMHMeshControl *this)

{
  int dim;
  _Rb_tree_color _Var1;
  TPZGeoMesh *pTVar2;
  long lVar3;
  TPZGeoEl *pTVar4;
  int iVar5;
  int iVar6;
  _Rb_tree_header *p_Var7;
  TPZGeoEl **ppTVar8;
  TPZCompMesh *this_00;
  TPZL2Projection<double> *this_01;
  _Base_ptr p_Var9;
  TPZBndCond *mat;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int iVar12;
  TPZL2Projection<double> *pTVar13;
  TPZCreateApproximationSpace *this_02;
  _Base_ptr p_Var14;
  _Self __tmp;
  long lVar15;
  int materialid;
  TPZGeoElSide neighbour;
  set<int,_std::less<int>,_std::allocator<int>_> bcids;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZVec<double> local_170;
  double dStack_150;
  TPZVec<double> local_148;
  double local_128;
  TPZFMatrix<double> local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  TPZGeoMesh::ResetReference(((this->fGMesh).fRef)->fPointer);
  pTVar2 = ((this->fGMesh).fRef)->fPointer;
  dim = pTVar2->fDim;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = (pTVar2->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < lVar3) {
    p_Var7 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
    lVar15 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(pTVar2->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar15);
      pTVar4 = *ppTVar8;
      if (pTVar4 != (TPZGeoEl *)0x0) {
        iVar5 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        p_Var9 = (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var7->_M_header;
        if (p_Var9 != (_Base_ptr)0x0 && iVar5 == dim) {
          do {
            if (lVar15 <= (long)*(size_t *)(p_Var9 + 1)) {
              p_Var10 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[(long)*(size_t *)(p_Var9 + 1) < lVar15];
          } while (p_Var9 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var10 != p_Var7) &&
             ((long)((_Rb_tree_header *)p_Var10)->_M_node_count <= lVar15)) {
            local_148._vptr_TPZVec =
                 (_func_int **)CONCAT44(local_148._vptr_TPZVec._4_4_,pTVar4->fMatId);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,(int *)&local_148);
            iVar5 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
            if (0 < iVar5) {
              iVar12 = 0;
              do {
                iVar6 = (**(code **)(*(long *)pTVar4 + 0x208))(pTVar4,iVar12);
                if (iVar6 == dim + -1) {
                  (**(code **)(*(long *)pTVar4 + 0x188))(&local_120,pTVar4,iVar12);
                  while (((TPZGeoEl *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
                          pTVar4 ||
                         ((int)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol != iVar12)
                         )) {
                    iVar6 = (**(code **)(*(long *)local_120.super_TPZMatrix<double>.
                                                  super_TPZBaseMatrix.fRow + 0x210))();
                    if (iVar6 == dim + -1) {
                      local_170._vptr_TPZVec =
                           (_func_int **)
                           CONCAT44(local_170._vptr_TPZVec._4_4_,
                                    *(int *)(local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.
                                             fRow + 0x18));
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>(&local_90,(int *)&local_170);
                    }
                    if ((TPZGeoEl *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
                        (TPZGeoEl *)0x0) {
                      local_170._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_018f8760;
                      local_170.fStore = (double *)0x0;
                      local_170.fNElements = CONCAT44(local_170.fNElements._4_4_,0xffffffff);
                    }
                    else {
                      (**(code **)(*(long *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.
                                            fRow + 0x188))
                                (&local_170,
                                 local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
                                 local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                                 0xffffffff);
                    }
                    local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                         (int64_t)local_170.fStore;
                    local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                         CONCAT44(local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                                  (undefined4)local_170.fNElements);
                  }
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 != iVar5);
            }
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar3);
  }
  this_00 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(this_00,&this->fGMesh,false);
  p_Var7 = &local_60._M_impl.super__Rb_tree_header;
  this_00->fDimModel = dim;
  TPZVec<double>::TPZVec(&local_170,0);
  local_170.fStore = &dStack_150;
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7c18;
  local_170.fNElements = 1;
  local_170.fNAlloc = 0;
  dStack_150 = 0.0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var7) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x211);
  }
  pTVar13 = (TPZL2Projection<double> *)0x0;
  p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    this_01 = (TPZL2Projection<double> *)operator_new(0xb0);
    TPZL2Projection<double>::TPZL2Projection(this_01,p_Var9[1]._M_color,dim,1,&local_170);
    TPZCompMesh::InsertMaterialObject(this_00,(TPZMaterial *)this_01);
    if (pTVar13 == (TPZL2Projection<double> *)0x0) {
      pTVar13 = this_01;
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while ((_Rb_tree_header *)p_Var9 != p_Var7);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_90._M_impl.super__Rb_tree_header) {
    p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
      local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_120.fElem = (double *)0x0;
      local_120.fGiven = (double *)0x0;
      local_120.fSize = 0;
      TPZVec<int>::TPZVec(&local_120.fPivot.super_TPZVec<int>,0);
      local_120.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_120.fPivot.super_TPZVec<int>.fStore = local_120.fPivot.fExtAlloc;
      local_120.fPivot.super_TPZVec<int>.fNElements = 0;
      local_120.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_120.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_120.fWork.fStore = (double *)0x0;
      local_120.fWork.fNElements = 0;
      local_120.fWork.fNAlloc = 0;
      local_120.fElem = (double *)operator_new__(0x20);
      local_120.fElem[2] = 0.0;
      local_120.fElem[3] = 0.0;
      *local_120.fElem = 0.0;
      local_120.fElem[1] = 0.0;
      local_128 = 0.0;
      TPZVec<double>::TPZVec(&local_148,2,&local_128);
      mat = (TPZBndCond *)
            (**(code **)(*(long *)pTVar13 + 0xb8))
                      (pTVar13,pTVar13,p_Var9[1]._M_color,0,&local_120,&local_148);
      TPZCompMesh::InsertMaterialObject(this_00,mat);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      local_148._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      if ((TPZGeoEl *)local_148.fStore != (TPZGeoEl *)0x0) {
        operator_delete__(local_148.fStore);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_120);
    } while ((_Rb_tree_header *)p_Var9 != &local_90._M_impl.super__Rb_tree_header);
  }
  this_02 = &this_00->fCreate;
  TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous(this_02);
  if (0 < lVar3) {
    p_Var7 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
    lVar15 = 0;
    do {
      ppTVar8 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(pTVar2->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar15);
      pTVar4 = *ppTVar8;
      if (pTVar4 != (TPZGeoEl *)0x0) {
        iVar5 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        p_Var9 = (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var7->_M_header;
        if (p_Var9 != (_Base_ptr)0x0 && iVar5 == dim) {
          do {
            if (lVar15 <= (long)*(size_t *)(p_Var9 + 1)) {
              p_Var10 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[(long)*(size_t *)(p_Var9 + 1) < lVar15];
          } while (p_Var9 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var10 != p_Var7) &&
             ((long)((_Rb_tree_header *)p_Var10)->_M_node_count <= lVar15)) {
            TPZCreateApproximationSpace::CreateCompEl(this_02,pTVar4,this_00);
            iVar5 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
            if (0 < iVar5) {
              iVar12 = 0;
              do {
                iVar6 = (**(code **)(*(long *)pTVar4 + 0x208))(pTVar4,iVar12);
                if (iVar6 == dim + -1) {
                  (**(code **)(*(long *)pTVar4 + 0x188))(&local_120,pTVar4,iVar12);
                  while (((TPZGeoEl *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
                          pTVar4 ||
                         ((int)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol != iVar12)
                         )) {
                    iVar6 = (**(code **)(*(long *)local_120.super_TPZMatrix<double>.
                                                  super_TPZBaseMatrix.fRow + 0x210))();
                    if (iVar6 == dim + -1) {
                      if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent !=
                          (_Base_ptr)0x0) {
                        iVar6 = *(int *)(local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
                                        + 0x18);
                        p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
                        p_Var10 = &local_90._M_impl.super__Rb_tree_header._M_header;
                        do {
                          p_Var14 = p_Var10;
                          p_Var11 = p_Var9;
                          _Var1 = p_Var11[1]._M_color;
                          p_Var10 = p_Var11;
                          if ((int)_Var1 < iVar6) {
                            p_Var10 = p_Var14;
                          }
                          p_Var9 = (&p_Var11->_M_left)[(int)_Var1 < iVar6];
                        } while ((&p_Var11->_M_left)[(int)_Var1 < iVar6] != (_Base_ptr)0x0);
                        if ((_Rb_tree_header *)p_Var10 != &local_90._M_impl.super__Rb_tree_header) {
                          if ((int)_Var1 < iVar6) {
                            p_Var11 = p_Var14;
                          }
                          if ((int)p_Var11[1]._M_color <= iVar6) {
                            TPZCreateApproximationSpace::CreateCompEl
                                      (this_02,(TPZGeoEl *)
                                               local_120.super_TPZMatrix<double>.super_TPZBaseMatrix
                                               .fRow,this_00);
                          }
                        }
                        goto LAB_01396e10;
                      }
LAB_01396e15:
                      (**(code **)(*(long *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.
                                            fRow + 0x188))
                                (&local_148,
                                 local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
                                 local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                                 0xffffffff);
                    }
                    else {
LAB_01396e10:
                      if ((TPZGeoEl *)local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow !=
                          (TPZGeoEl *)0x0) goto LAB_01396e15;
                      local_148._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_018f8760;
                      local_148.fStore = (double *)0x0;
                      local_148.fNElements._0_4_ = 0xffffffff;
                    }
                    local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                         (int64_t)local_148.fStore;
                    local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol =
                         CONCAT44(local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                                  (undefined4)local_148.fNElements);
                  }
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 != iVar5);
            }
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar3);
  }
  TPZCreateApproximationSpace::CreateInterfaces(this_00);
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  if (local_170.fStore != &dStack_150) {
    local_170.fNAlloc = 0;
    local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_170.fStore != (double *)0x0) {
      operator_delete__(local_170.fStore);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return this_00;
}

Assistant:

TPZCompMesh* TPZMHMeshControl::CriaMalhaTemporaria()
{
    fGMesh->ResetReference();
	/// criar materiais
	int dim = fGMesh->Dimension();
    std::set<int> matids, bcids;
    TPZGeoMesh &gmesh = fGMesh;
    int64_t nel = gmesh.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        int materialid = gel->MaterialId();
        matids.insert(materialid);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    bcids.insert(neighbour.Element()->MaterialId());
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCompMesh *cmesh = new TPZCompMesh(fGMesh);
	cmesh->SetDimModel(dim);
    TPZManVector<STATE,1> sol(1,0.);
    int nstate = 1;
    std::set<int>::iterator it = matids.begin();
    TPZMaterialT<STATE> *meshmat = nullptr;
    while (it != matids.end()) {
        TPZL2Projection<STATE> *material = new TPZL2Projection(*it,dim,nstate,sol);
        cmesh->InsertMaterialObject(material);
        if (!meshmat) {
            meshmat = material;
        }
        it++;

    }

    if (!meshmat) {
        DebugStop();
    }

	it = bcids.begin();
    while (it != bcids.end()) {
        ///Inserir condicao de contorno
        TPZFMatrix<STATE> val1(2,2,0.);
        TPZVec<STATE> val2(2,0.);

        TPZBndCond * BCondD1 = meshmat->CreateBC(meshmat, *it,0, val1, val2);
        cmesh->InsertMaterialObject(BCondD1);

        it++;
    }

    cmesh->SetAllCreateFunctionsDiscontinuous();
    TPZCreateApproximationSpace &create = cmesh->ApproxSpace();

    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        create.CreateCompEl(gel, *cmesh);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    int matid = neighbour.Element()->MaterialId();
                    if (bcids.find(matid) != bcids.end()) {
                        create.CreateCompEl(neighbour.Element(), *cmesh);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCreateApproximationSpace::CreateInterfaces(*cmesh);
    cmesh->ExpandSolution();
    return cmesh;
}